

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefIsNull(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Expression *value;
  RefIsNull *pRVar1;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1296,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
  }
  if (((this->wasm->features).features & 0x100) != 0) {
    type_00 = getReferenceType(this);
    value = make(this,type_00);
    pRVar1 = Builder::makeRefIsNull(&this->builder,value);
    return (Expression *)pRVar1;
  }
  __assert_fail("wasm.features.hasReferenceTypes()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1297,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeRefIsNull(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes());
  return builder.makeRefIsNull(make(getReferenceType()));
}